

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_color_selectors(crn_comp *this)

{
  vector<unsigned_short> *this_00;
  unsigned_short uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_short *puVar5;
  uint error;
  uint8 d3;
  uint8 d2;
  uint8 d1;
  uint8 d0;
  uint32 selector;
  ushort uStack_10178;
  uint16 i_3;
  uint min_error;
  uint16 selected_index;
  uint16 left;
  uint32 selected_selector;
  uint16 i_2;
  undefined1 auStack_10160 [8];
  vector<unsigned_short> indices;
  vector<unsigned_int> selectors;
  byte abStack_10138 [4];
  uint32 i_1;
  uint8 D8 [65536];
  ushort local_12a;
  char acStack_128 [6];
  uint16 i;
  uint8 D4 [256];
  char local_1e [4];
  ushort local_1a;
  uint8 d [4];
  vector<unsigned_short> *pvStack_18;
  uint16 n;
  vector<unsigned_short> *remapping;
  crn_comp *this_local;
  
  pvStack_18 = this->m_selector_remaping;
  uVar2 = vector<unsigned_int>::size(&this->m_color_selectors);
  local_1a = (ushort)uVar2;
  vector<unsigned_short>::resize(pvStack_18,uVar2 & 0xffff,false);
  local_1e[0] = '\0';
  local_1e[1] = '\x05';
  local_1e[2] = '\x0e';
  local_1e[3] = '\n';
  for (local_12a = 0; local_12a < 0x100; local_12a = local_12a + 1) {
    acStack_128[local_12a] =
         local_1e[(int)(((uint)local_12a ^ (int)(uint)local_12a >> 4) & 3)] +
         local_1e[(int)(((int)(uint)local_12a >> 2 ^ (int)(uint)local_12a >> 6) & 3)];
  }
  for (selectors.m_capacity = 0; selectors.m_capacity < 0x10000;
      selectors.m_capacity = selectors.m_capacity + 1) {
    abStack_10138[selectors.m_capacity] =
         acStack_128[selectors.m_capacity >> 8 & 0xf0 | selectors.m_capacity >> 4 & 0xf] +
         acStack_128[selectors.m_capacity >> 4 & 0xf0 | selectors.m_capacity & 0xf];
  }
  vector<unsigned_int>::vector((vector<unsigned_int> *)&indices.m_size,(uint)local_1a);
  vector<unsigned_short>::vector((vector<unsigned_short> *)auStack_10160,(uint)local_1a);
  for (left = 0; left < local_1a; left = left + 1) {
    puVar4 = vector<unsigned_int>::operator[](&this->m_color_selectors,(uint)left);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&indices.m_size,(uint)left);
    *puVar4 = uVar3;
    puVar5 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)auStack_10160,(uint)left);
    *puVar5 = left;
  }
  min_error = 0;
  i_3 = local_1a;
  while (i_3 != 0) {
    uStack_10178 = 0;
    selector = 0xffffffff;
    for (_d1 = 0; _d1 < i_3; _d1 = _d1 + 1) {
      puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&indices.m_size,(uint)_d1);
      uVar3 = *puVar4;
      uVar3 = (uint)abStack_10138[uVar3 >> 0x10 & 0xff00 | min_error >> 0x18] +
              (uint)abStack_10138[uVar3 >> 8 & 0xff00 | min_error >> 0x10 & 0xff] +
              (uint)abStack_10138[uVar3 & 0xff00 | min_error >> 8 & 0xff] +
              (uint)abStack_10138[(uVar3 & 0xff) << 8 | min_error & 0xff];
      if (uVar3 < selector) {
        uStack_10178 = _d1;
        selector = uVar3;
      }
    }
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&indices.m_size,(uint)uStack_10178);
    this_00 = pvStack_18;
    min_error = *puVar4;
    uVar1 = local_1a - i_3;
    puVar5 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)auStack_10160,(uint)uStack_10178);
    puVar5 = vector<unsigned_short>::operator[](this_00,(uint)*puVar5);
    *puVar5 = uVar1;
    i_3 = i_3 - 1;
    puVar4 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&indices.m_size,(uint)i_3);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)&indices.m_size,(uint)uStack_10178);
    *puVar4 = uVar3;
    puVar5 = vector<unsigned_short>::operator[]((vector<unsigned_short> *)auStack_10160,(uint)i_3);
    uVar1 = *puVar5;
    puVar5 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)auStack_10160,(uint)uStack_10178);
    *puVar5 = uVar1;
  }
  pack_color_selectors(this,&this->m_packed_color_selectors,pvStack_18);
  vector<unsigned_short>::~vector((vector<unsigned_short> *)auStack_10160);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&indices.m_size);
  return;
}

Assistant:

void crn_comp::optimize_color_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cColor];
        uint16 n = m_color_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 5, 14, 10 };

        uint8 D4[0x100];
        for (uint16 i = 0; i < 0x100; i++)
        {
            D4[i] = d[(i ^ i >> 4) & 3] + d[(i >> 2 ^ i >> 6) & 3];
        }
        uint8 D8[0x10000];
        for (uint32 i = 0; i < 0x10000; i++)
        {
            D8[i] = D4[(i >> 8 & 0xF0) | (i >> 4 & 0xF)] + D4[(i >> 4 & 0xF0) | (i & 0xF)];
        }

        crnlib::vector<uint32> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_color_selectors[i];
            indices[i] = i;
        }
        uint32 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint32 selector = selectors[i];
                uint8 d0 = D8[(selector >> 16 & 0xFF00) | (selected_selector >> 24 & 0xFF)];
                uint8 d1 = D8[(selector >> 8 & 0xFF00) | (selected_selector >> 16 & 0xFF)];
                uint8 d2 = D8[(selector & 0xFF00) | (selected_selector >> 8 & 0xFF)];
                uint8 d3 = D8[(selector << 8 & 0xFF00) | (selected_selector & 0xFF)];
                uint error = d0 + d1 + d2 + d3;
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_color_selectors(m_packed_color_selectors, remapping);
    }